

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::set(Calendar *this,UCalendarDateFields field,int32_t value)

{
  int iVar1;
  undefined4 local_1c;
  int32_t local_18;
  UErrorCode ec;
  int32_t value_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  
  local_18 = value;
  ec = field;
  _value_local = this;
  if (this->fAreFieldsVirtuallySet != '\0') {
    local_1c = 0;
    (*(this->super_UObject)._vptr_UObject[0x1d])(this,&local_1c);
  }
  this->fFields[(uint)ec] = local_18;
  if (this->fNextStamp == 10000) {
    recalculateStamp(this);
  }
  iVar1 = this->fNextStamp;
  this->fNextStamp = iVar1 + 1;
  this->fStamp[(uint)ec] = iVar1;
  this->fIsSet[(uint)ec] = '\x01';
  this->fAreFieldsVirtuallySet = '\0';
  this->fAreFieldsSet = '\0';
  this->fIsTimeSet = '\0';
  return;
}

Assistant:

void
Calendar::set(UCalendarDateFields field, int32_t value)
{
    if (fAreFieldsVirtuallySet) {
        UErrorCode ec = U_ZERO_ERROR;
        computeFields(ec);
    }
    fFields[field]     = value;
    /* Ensure that the fNextStamp value doesn't go pass max value for int32_t */
    if (fNextStamp == STAMP_MAX) {
        recalculateStamp();
    }
    fStamp[field]     = fNextStamp++;
    fIsSet[field]     = TRUE; // Remove later
    fIsTimeSet = fAreFieldsSet = fAreFieldsVirtuallySet = FALSE;
}